

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlCatalogNormalizePublic(xmlChar *pubID)

{
  bool bVar1;
  bool bVar2;
  xmlChar *local_38;
  xmlChar *q;
  xmlChar *ret;
  xmlChar *p;
  int white;
  int ok;
  xmlChar *pubID_local;
  
  bVar1 = true;
  if (pubID == (xmlChar *)0x0) {
    pubID_local = (xmlChar *)0x0;
  }
  else {
    bVar2 = true;
    for (ret = pubID; *ret != '\0' && bVar1; ret = ret + 1) {
      if (((*ret == ' ') || ((8 < *ret && (*ret < 0xb)))) || (*ret == '\r')) {
        if ((*ret != ' ') || (bVar2)) {
          bVar1 = false;
        }
        else {
          bVar2 = true;
        }
      }
      else {
        bVar2 = false;
      }
    }
    if ((!bVar1) || (bVar2)) {
      pubID_local = xmlStrdup(pubID);
      bVar1 = false;
      local_38 = pubID_local;
      for (ret = pubID; *ret != '\0'; ret = ret + 1) {
        if ((*ret == ' ') || (((8 < *ret && (*ret < 0xb)) || (*ret == '\r')))) {
          if (local_38 != pubID_local) {
            bVar1 = true;
          }
        }
        else {
          if (bVar1) {
            *local_38 = ' ';
            bVar1 = false;
            local_38 = local_38 + 1;
          }
          *local_38 = *ret;
          local_38 = local_38 + 1;
        }
      }
      *local_38 = '\0';
    }
    else {
      pubID_local = (xmlChar *)0x0;
    }
  }
  return pubID_local;
}

Assistant:

static xmlChar *
xmlCatalogNormalizePublic(const xmlChar *pubID)
{
    int ok = 1;
    int white;
    const xmlChar *p;
    xmlChar *ret;
    xmlChar *q;

    if (pubID == NULL)
        return(NULL);

    white = 1;
    for (p = pubID;*p != 0 && ok;p++) {
        if (!xmlIsBlank_ch(*p))
            white = 0;
        else if (*p == 0x20 && !white)
            white = 1;
        else
            ok = 0;
    }
    if (ok && !white)	/* is normalized */
        return(NULL);

    ret = xmlStrdup(pubID);
    q = ret;
    white = 0;
    for (p = pubID;*p != 0;p++) {
        if (xmlIsBlank_ch(*p)) {
            if (q != ret)
                white = 1;
        } else {
            if (white) {
                *(q++) = 0x20;
                white = 0;
            }
            *(q++) = *p;
        }
    }
    *q = 0;
    return(ret);
}